

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::python::Generator::
GetResolvedFeatures<google::protobuf::OneofDescriptor>
          (string *__return_storage_ptr__,Generator *this,OneofDescriptor *descriptor)

{
  FileDescriptor *this_00;
  ushort *puVar1;
  FieldDescriptor *this_01;
  char *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  Descriptor *pDVar6;
  DynamicMessageFactory *pDVar7;
  undefined4 extraout_var;
  MessageLite *this_02;
  EnumDescriptor *this_03;
  EnumValueDescriptor *pEVar8;
  undefined8 *puVar9;
  AlphaNum *pAVar10;
  size_type in_R9;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  Metadata MVar11;
  string_view name;
  string_view data;
  string_view str;
  string_view v;
  string_view str_00;
  string_view v_00;
  string_view str_01;
  string_view v_01;
  UntypedFormatSpecImpl format;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  feature_args;
  string local_1b0;
  DynamicMessageFactory *local_180;
  string *local_178;
  code *local_170;
  undefined1 local_168 [32];
  long local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  string local_118;
  string *local_f8;
  Generator *local_f0;
  Reflection *local_e8;
  string local_e0;
  string local_c0;
  size_type local_a0;
  pointer local_98;
  AlphaNum local_90;
  AlphaNum local_60;
  
  bVar4 = GeneratingDescriptorProto(this);
  if (bVar4) {
    this_00 = this->file_;
    MVar11 = FeatureSet::GetMetadata((FeatureSet *)_FeatureSet_default_instance_);
    puVar1 = (ushort *)((MVar11.descriptor)->all_names_).payload_;
    name._M_len = (ulong)*puVar1;
    name._M_str = (char *)((long)puVar1 + ~name._M_len);
    pDVar6 = FileDescriptor::FindMessageTypeByName(this_00,name);
    if (pDVar6 == (Descriptor *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/generator.cc"
                 ,0x1d0,"feature_set != nullptr");
      str_01._M_str = "Malformed descriptor.proto doesn\'t contain ";
      str_01._M_len = 0x2b;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)&local_1b0,str_01);
      MVar11 = FeatureSet::GetMetadata((FeatureSet *)_FeatureSet_default_instance_);
      pcVar2 = ((MVar11.descriptor)->all_names_).payload_;
      v_01._M_len = (ulong)*(ushort *)(pcVar2 + 2);
      v_01._M_str = pcVar2 + ~v_01._M_len;
      absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)&local_1b0,v_01);
LAB_001f5c6f:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_1b0);
    }
    pDVar7 = (DynamicMessageFactory *)operator_new(0x40);
    DynamicMessageFactory::DynamicMessageFactory(pDVar7);
    iVar5 = (*(pDVar7->super_MessageFactory)._vptr_MessageFactory[2])(pDVar7);
    this_02 = MessageLite::New((MessageLite *)CONCAT44(extraout_var,iVar5),(Arena *)0x0);
    MessageLite::SerializeAsString_abi_cxx11_
              (&local_1b0,(MessageLite *)descriptor->merged_features_);
    data._M_str = local_1b0._M_dataplus._M_p;
    data._M_len = local_1b0._M_string_length;
    MessageLite::ParseFromString(this_02,data);
    local_f8 = __return_storage_ptr__;
    local_f0 = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    local_138.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MVar11 = Message::GetMetadata((Message *)this_02);
    local_e8 = MVar11.reflection;
    local_168._16_8_ = (undefined8 *)0x0;
    local_168._24_8_ = (undefined8 *)0x0;
    local_148 = 0;
    local_180 = pDVar7;
    Reflection::ListFields
              (local_e8,(Message *)this_02,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)(local_168 + 0x10));
    uVar3 = local_168._24_8_;
    if (local_168._16_8_ != local_168._24_8_) {
      puVar9 = (undefined8 *)local_168._16_8_;
      do {
        this_01 = (FieldDescriptor *)*puVar9;
        if (this_01->type_ == '\x0e') {
          if ((this_01->options_->field_0)._impl_.retention_ != 2) {
            this_03 = FieldDescriptor::enum_type(this_01);
            iVar5 = Reflection::GetEnumValue(local_e8,(Message *)this_02,this_01);
            pEVar8 = EnumDescriptor::FindValueByNumber(this_03,iVar5);
            puVar1 = (ushort *)(this_01->all_names_).payload_;
            local_1b0._M_dataplus._M_p = (pointer)(ulong)*puVar1;
            local_1b0._M_string_length = ~(ulong)local_1b0._M_dataplus._M_p + (long)puVar1;
            local_60.piece_._M_len = 1;
            local_60.piece_._M_str = "=";
            ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>(&local_e0,local_f0,this_03);
            local_98 = (pEVar8->all_names_->_M_dataplus)._M_p;
            local_a0 = pEVar8->all_names_->_M_string_length;
            local_170 = absl::lts_20250127::str_format_internal::FormatArgImpl::
                        Dispatch<std::__cxx11::string>;
            local_168._0_8_ = &local_a0;
            local_168._8_8_ =
                 absl::lts_20250127::str_format_internal::FormatArgImpl::
                 Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
            args.len_ = in_R9;
            args.ptr_ = (pointer)0x2;
            pAVar10 = (AlphaNum *)0x2;
            format.size_ = (size_t)&local_178;
            format.data_ = (void *)0x1e;
            local_178 = &local_e0;
            absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
                      (&local_118,(str_format_internal *)"%s.values_by_name[\"%s\"].number",format,
                       args);
            local_90.piece_._M_len = local_118._M_string_length;
            local_90.piece_._M_str = local_118._M_dataplus._M_p;
            absl::lts_20250127::StrCat_abi_cxx11_
                      (&local_c0,(lts_20250127 *)&local_1b0,&local_60,&local_90,pAVar10);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_138,&local_c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else {
          if ((this_01->field_0x1 & 8) == 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/generator.cc"
                       ,0x1e3,"field->is_extension()");
            str._M_str = "Unsupported non-enum global feature found: ";
            str._M_len = 0x2b;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      ((LogMessage *)&local_1b0,str);
            pcVar2 = (this_01->all_names_).payload_;
            v._M_len = (ulong)*(ushort *)(pcVar2 + 2);
            v._M_str = pcVar2 + ~v._M_len;
            absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)&local_1b0,v);
            goto LAB_001f5c6f;
          }
          if (this_01->number_ == 0x3eb) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/generator.cc"
                       ,0x1e7,"field->number() != 1003");
            str_00._M_str = "Unsupported python-specific feature found: ";
            str_00._M_len = 0x2b;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      ((LogMessage *)&local_1b0,str_00);
            pcVar2 = (this_01->all_names_).payload_;
            v_00._M_len = (ulong)*(ushort *)(pcVar2 + 2);
            v_00._M_str = pcVar2 + ~v_00._M_len;
            absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)&local_1b0,v_00);
            goto LAB_001f5c6f;
          }
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 != (undefined8 *)uVar3);
    }
    local_1b0._M_dataplus._M_p = (pointer)0x12;
    local_1b0._M_string_length = 0x565523;
    pAVar10 = (AlphaNum *)0x62f992;
    absl::lts_20250127::strings_internal::
    JoinAlgorithm<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              (&local_178,
               (strings_internal *)
               local_138.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_138.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,1);
    __return_storage_ptr__ = local_f8;
    pDVar7 = local_180;
    local_60.piece_._M_len = (size_t)local_170;
    local_60.piece_._M_str = (char *)local_178;
    local_90.piece_._M_len = 1;
    local_90.piece_._M_str = ")";
    absl::lts_20250127::StrCat_abi_cxx11_
              (local_f8,(lts_20250127 *)&local_1b0,&local_60,&local_90,pAVar10);
    if (local_178 != (string *)local_168) {
      operator_delete(local_178,(ulong)(local_168._0_8_ + 1));
    }
    if ((undefined8 *)local_168._16_8_ != (undefined8 *)0x0) {
      operator_delete((void *)local_168._16_8_,local_148 - local_168._16_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_138);
    (*this_02->_vptr_MessageLite[1])(this_02);
    (*(pDVar7->super_MessageFactory)._vptr_MessageFactory[1])(pDVar7);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"None","");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::GetResolvedFeatures(
    const DescriptorT& descriptor) const {
  if (!GeneratingDescriptorProto()) {
    // Everything but descriptor.proto can handle proper feature resolution.
    return "None";
  }

  // Load the resolved features from our pool.
  const Descriptor* feature_set =
      file_->FindMessageTypeByName(FeatureSet::GetDescriptor()->name());
  ABSL_CHECK(feature_set != nullptr)
      << "Malformed descriptor.proto doesn't contain "
      << FeatureSet::GetDescriptor()->full_name();
  auto message_factory = absl::make_unique<DynamicMessageFactory>();
  auto features =
      absl::WrapUnique(message_factory->GetPrototype(feature_set)->New());
  features->ParseFromString(
      GetResolvedSourceFeatures(descriptor).SerializeAsString());

  // Collect all of the resolved features.
  std::vector<std::string> feature_args;
  const Reflection* reflection = features->GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*features, &fields);
  for (const auto* field : fields) {
    // Assume these are all enums.  If we add non-enum global features or any
    // python-specific features, we will need to come back and improve this
    // logic.
    if (field->type() != FieldDescriptor::TYPE_ENUM) {
      ABSL_CHECK(field->is_extension())
          << "Unsupported non-enum global feature found: "
          << field->full_name();
      // Placeholder for python-specific features.
      ABSL_CHECK(field->number() != 1003)
          << "Unsupported python-specific feature found: "
          << field->full_name();
      // Skip any non-python language-specific features.
      continue;
    }
    if (field->options().retention() == FieldOptions::RETENTION_SOURCE) {
      // Skip any source-retention features.
      continue;
    }
    const EnumDescriptor* enm = field->enum_type();
    const EnumValueDescriptor* value =
        enm->FindValueByNumber(reflection->GetEnumValue(*features, field));

    feature_args.emplace_back(absl::StrCat(
        field->name(), "=",
        absl::StrFormat("%s.values_by_name[\"%s\"].number",
                        ModuleLevelDescriptorName(*enm), value->name())));
  }
  return absl::StrCat("_ResolvedFeatures(", absl::StrJoin(feature_args, ","),
                      ")");
}